

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::~VaryingComponentsTest(VaryingComponentsTest *this)

{
  VaryingComponentsTest *this_local;
  
  (this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase.super_TestCase.
  super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)&PTR__VaryingComponentsTest_0321ffb0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_data);
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::~vector(&this->m_test_cases);
  VaryingLocationsTest::~VaryingLocationsTest(&this->super_VaryingLocationsTest);
  return;
}

Assistant:

~VaryingComponentsTest()
	{
	}